

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  Format FVar1;
  int minX;
  long *plVar2;
  LineBuffer *pLVar3;
  PixelType *pPVar4;
  int iVar5;
  int iVar6;
  Compression *pCVar7;
  Compressor *pCVar8;
  Data *pDVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int x;
  LineBuffer *pLVar14;
  char *pcVar15;
  bool bVar16;
  char *readPtr;
  long local_38;
  
  pLVar14 = this->_lineBuffer;
  if ((pLVar14->buffer)._size == 0) {
    pDVar9 = this->_ofd;
    iVar5 = *(int *)((long)&(pDVar9->offsetInLineBuffer).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    FVar1 = *(Format *)((long)&pLVar14->endOfLineBufferData + 4);
    if ((int)pDVar9->format < (int)FVar1) {
      FVar1 = pDVar9->format;
    }
    lVar11 = (long)(int)(FVar1 - iVar5);
    pcVar15 = (char *)0x0;
    lVar10 = (long)(*(int *)&pLVar14->endOfLineBufferData - iVar5);
    for (lVar13 = lVar10; lVar13 <= lVar11; lVar13 = lVar13 + 1) {
      pcVar15 = pcVar15 + *(int *)((pDVar9->lineBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar13);
    }
    plVar2 = *(long **)&pLVar14->minY;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
      pDVar9 = this->_ofd;
      iVar5 = *(int *)((long)&(pDVar9->offsetInLineBuffer).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      lVar10 = (long)(*(int *)&this->_lineBuffer->endOfLineBufferData - iVar5);
      lVar11 = (long)(int)(FVar1 - iVar5);
    }
    pLVar14 = (LineBuffer *)0x0;
    for (; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
      pLVar3 = (pDVar9->lineBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar10];
      if (pLVar14 < pLVar3) {
        pLVar14 = pLVar3;
      }
    }
    pCVar7 = Header::compression((Header *)
                                 &(pDVar9->header)._map._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
    pCVar8 = newCompressor(*pCVar7,(size_t)pLVar14,
                           (Header *)
                           &(this->_ofd->header)._map._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
    pLVar14 = this->_lineBuffer;
    *(Compressor **)&pLVar14->minY = pCVar8;
    if ((pCVar8 == (Compressor *)0x0) || (pcVar15 <= pLVar14->dataPtr)) {
      pLVar14->scanLineMin = 1;
      (pLVar14->buffer)._size = (long)(pLVar14->buffer)._data;
    }
    else {
      iVar5 = (*pCVar8->_vptr_Compressor[3])(pCVar8);
      pLVar14 = this->_lineBuffer;
      pLVar14->scanLineMin = iVar5;
      iVar5 = (**(code **)(**(long **)&pLVar14->minY + 0x30))
                        (*(long **)&pLVar14->minY,(pLVar14->buffer)._data,
                         *(undefined4 *)&pLVar14->dataPtr,
                         *(undefined4 *)&pLVar14->endOfLineBufferData);
      this->_lineBuffer->dataPtr = (char *)(long)iVar5;
    }
  }
  pDVar9 = this->_ofd;
  bVar16 = *(int *)&(pDVar9->offsetInLineBuffer).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish == 0;
  iVar5 = *(int *)(this + 1) + -1;
  if (bVar16) {
    iVar5 = *(int *)&this[1].field_0x4 + 1;
  }
  x = *(int *)(this + 1);
  if (!bVar16) {
    x = *(int *)&this[1].field_0x4;
  }
  for (; x != iVar5; x = x + (bVar16 - 1) + (uint)bVar16) {
    local_38 = (long)x;
    readPtr = (char *)((this->_lineBuffer->buffer)._size +
                      *(long *)(*(long *)&pDVar9->linesInBuffer +
                               (local_38 -
                               *(int *)((long)&(pDVar9->offsetInLineBuffer).
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * 8));
    uVar12 = 0;
    while( true ) {
      if ((ulong)(*(long *)&pDVar9->_deleteStream - (long)pDVar9->_streamData >> 3) <= (ulong)uVar12
         ) break;
      pPVar4 = *(PixelType **)
                ((long)&(pDVar9->_streamData->super_Mutex).super___mutex_base._M_mutex +
                (ulong)uVar12 * 8);
      iVar6 = Imath_2_5::modp(x,pPVar4[0xd]);
      if (iVar6 == 0) {
        if (*(byte *)((long)pPVar4 + 0x39) == 1) {
          skipChannel(&readPtr,pPVar4[1],
                      (ulong)*(uint *)((long)this->_ofd[1].frameBuffer._map._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_left +
                                      (local_38 -
                                      *(int *)((long)&(this->_ofd->offsetInLineBuffer).
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4)) * 4));
        }
        else {
          pDVar9 = this->_ofd;
          iVar6 = *(int *)&(pDVar9->offsetInLineBuffer).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
          minX = *(int *)((long)&(pDVar9->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 4);
          lVar13 = (long)(iVar6 - minX) + 1;
          copyIntoDeepFrameBuffer
                    (&readPtr,*(char **)(pPVar4 + 2),
                     (char *)(*(long *)&pDVar9[1].frameBuffer._map._M_t._M_impl.
                                        super__Rb_tree_header._M_header + (long)minX * -4 +
                             *(int *)((long)&(pDVar9->offsetInLineBuffer).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             * lVar13 * -4),4,(long)(int)lVar13 << 2,x,minX,iVar6,0,0,0,0,
                     *(undefined8 *)(pPVar4 + 10),*(undefined8 *)(pPVar4 + 6),
                     *(undefined8 *)(pPVar4 + 8),SUB41(pPVar4[0xe],0),*(double *)(pPVar4 + 0x10),
                     this->_lineBuffer->scanLineMin,*pPVar4,pPVar4[1]);
        }
      }
      uVar12 = uVar12 + 1;
      pDVar9 = this->_ofd;
    }
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
	// frame buffer into the line buffer
        //
        
        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop = _lineBuffer->scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop = _lineBuffer->scanLineMin - 1;
            dy = -1;
        }
    
	int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //
        
            char *writePtr = _lineBuffer->buffer +
                             _ofd->offsetInLineBuffer[y - _ofd->minY];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
		// (the scan line contains data only if y % ySampling == 0).
                //
        
                const OutSliceInfo &slice = _ofd->slices[i];
        
                if (modp (y, slice.ySampling) != 0)
                    continue;
        
                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //
        
                int dMinX = divp (_ofd->minX, slice.xSampling);
                int dMaxX = divp (_ofd->maxX, slice.xSampling);
        
                //
		// Fill the line buffer with with pixel data.
                //
        
                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // If necessary, convert the pixel data to Xdr format.
		    // Then store the pixel data in _ofd->lineBuffer.
                    //
        
                    const char *linePtr = slice.base +
                                          divp (y, slice.ySampling) *
                                          slice.yStride;
        
                    const char *readPtr = linePtr + dMinX * slice.xStride;
                    const char *endPtr  = linePtr + dMaxX * slice.xStride;
    
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        
            if (_lineBuffer->endOfLineBufferData < writePtr)
                _lineBuffer->endOfLineBufferData = writePtr;
        
            #ifdef DEBUG
        
                assert (writePtr - (_lineBuffer->buffer +
                        _ofd->offsetInLineBuffer[y - _ofd->minY]) ==
                        (int) _ofd->bytesPerLine[y - _ofd->minY]);
        
            #endif
        
        }
    
        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we are done, otherwise compress the linebuffer
        //
    
        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY)
            return;
    
        _lineBuffer->dataPtr = _lineBuffer->buffer;

        _lineBuffer->dataSize = _lineBuffer->endOfLineBufferData -
                                _lineBuffer->buffer;
    
	//
        // Compress the data
	//

        Compressor *compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char *compPtr;

            int compSize = compressor->compress (_lineBuffer->dataPtr,
                                                 _lineBuffer->dataSize,
                                                 _lineBuffer->minY, compPtr);
    
            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //
    
                convertToXdr (_ofd, _lineBuffer->buffer, _lineBuffer->minY,
                              _lineBuffer->maxY, _lineBuffer->dataSize);
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}